

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O2

PyObject * libxml_getObjDesc(PyObject *self,PyObject *args)

{
  int iVar1;
  undefined8 uVar2;
  PyObject *pPVar3;
  PyObject *obj;
  undefined8 local_10;
  
  pPVar3 = (PyObject *)0x0;
  iVar1 = _PyArg_ParseTuple_SizeT(args,"O:getObjDesc",&local_10);
  if (iVar1 != 0) {
    uVar2 = PyCapsule_GetName(local_10);
    uVar2 = PyCapsule_GetPointer(local_10,uVar2);
    pPVar3 = (PyObject *)_Py_BuildValue_SizeT("s",uVar2);
  }
  return pPVar3;
}

Assistant:

static PyObject *
libxml_getObjDesc(PyObject *self ATTRIBUTE_UNUSED, PyObject *args) {

    PyObject *obj;
    char *str;

    if (!PyArg_ParseTuple(args, (char *)"O:getObjDesc", &obj))
        return NULL;
    str = PyCapsule_GetPointer(obj, PyCapsule_GetName(obj));
    return Py_BuildValue((char *)"s", str);
}